

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_all.cc
# Opt level: O2

int X509_sign_ctx(X509 *x,EVP_MD_CTX *ctx)

{
  int iVar1;
  
  asn1_encoding_clear((ASN1_ENCODING *)&x->cert_info->enc);
  iVar1 = ASN1_item_sign_ctx((ASN1_ITEM *)&X509_CINF_it,x->cert_info->signature,x->sig_alg,
                             x->signature,x->cert_info,ctx);
  return iVar1;
}

Assistant:

int X509_sign_ctx(X509 *x, EVP_MD_CTX *ctx) {
  asn1_encoding_clear(&x->cert_info->enc);
  return ASN1_item_sign_ctx(ASN1_ITEM_rptr(X509_CINF), x->cert_info->signature,
                            x->sig_alg, x->signature, x->cert_info, ctx);
}